

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O3

void prframe(FILE *file,timeval *tv,int dev,canfd_frame *cf,uint max_dlen,char *extra_info)

{
  fprintf((FILE *)file,"(%lu.%06lu) ",tv->tv_sec);
  if (dev < 1) {
    fwrite("canX ",5,1,(FILE *)file);
  }
  else {
    fprintf((FILE *)file,"can%d ",(ulong)(dev - 1));
  }
  fprint_canframe(file,cf,extra_info,0,max_dlen);
  return;
}

Assistant:

void prframe(FILE *file, struct timeval *tv, int dev, struct canfd_frame *cf, unsigned int max_dlen, char *extra_info) {

	fprintf(file, "(%lu.%06lu) ", tv->tv_sec, tv->tv_usec);

	if (dev > 0)
		fprintf(file, "can%d ", dev-1);
	else
		fprintf(file, "canX ");

	fprint_canframe(file, cf, extra_info, 0, max_dlen);
}